

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

uint __thiscall
Lib::
BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
::bubbleDown(BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
             *this,uint index)

{
  uint uVar1;
  uint uVar2;
  Constraint_Generator **ppCVar3;
  Constraint_Generator *pCVar4;
  uint uVar5;
  uint uVar6;
  Constraint_Generator **ppCVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar8 = (ulong)index;
  uVar1 = this->_size;
  do {
    uVar5 = (uint)uVar8;
    uVar6 = uVar5 * 2;
    if (uVar1 < uVar6) {
      return uVar5;
    }
    ppCVar3 = this->_data1;
    pCVar4 = ppCVar3[uVar8];
    if (uVar6 == uVar1) {
      uVar9 = pCVar4->_weight;
LAB_0025dd4d:
      if (uVar9 <= ppCVar3[uVar6]->_weight) {
        return uVar5;
      }
      ppCVar7 = ppCVar3 + uVar6;
      ppCVar3[uVar8] = ppCVar3[uVar6];
      uVar10 = uVar6;
    }
    else {
      uVar10 = uVar6 | 1;
      uVar9 = pCVar4->_weight;
      uVar2 = ppCVar3[uVar10]->_weight;
      if (uVar9 <= uVar2) goto LAB_0025dd4d;
      if (ppCVar3[uVar6]->_weight < uVar2) {
        ppCVar7 = ppCVar3 + uVar6;
        ppCVar3[uVar8] = ppCVar3[uVar6];
        uVar10 = uVar6;
      }
      else {
        ppCVar7 = ppCVar3 + uVar10;
        ppCVar3[uVar8] = ppCVar3[uVar10];
      }
    }
    *ppCVar7 = pCVar4;
    uVar8 = (ulong)uVar10;
  } while( true );
}

Assistant:

unsigned bubbleDown(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index<<1;
    while(nextIndex<=_size) {
      if(nextIndex!=_size && Comparator::compare(_data1[index], _data1[nextIndex|1])==GREATER) {
	if(Comparator::compare(_data1[nextIndex|1], _data1[nextIndex])==GREATER) {
	  std::swap(_data1[index], _data1[nextIndex]);
	} else {
	  std::swap(_data1[index], _data1[nextIndex|1]);
	  nextIndex|=1;
	}
      } else if(Comparator::compare(_data1[index], _data1[nextIndex])==GREATER) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index<<1;
    }
    return index;
  }